

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.hpp
# Opt level: O0

void __thiscall Kernel::Literal::Literal(Literal *this,uint functor,uint arity,bool polarity)

{
  uint in_EDX;
  undefined4 in_ESI;
  TermList *in_RDI;
  undefined1 in_stack_ffffffffffffffdf;
  
  Term::Term((Term *)CONCAT44(in_ESI,in_EDX));
  in_RDI->_content = (uint64_t)&PTR_computable_01320218;
  *(undefined4 *)&in_RDI[1]._content = in_ESI;
  *(uint *)((long)&in_RDI[1]._content + 4) =
       *(uint *)((long)&in_RDI[1]._content + 4) & 0xf0000000 | in_EDX & 0xfffffff;
  TermList::_setPolarity(in_RDI,(bool)in_stack_ffffffffffffffdf);
  TermList::_setSort(in_RDI,(bool)in_stack_ffffffffffffffdf);
  TermList::_setLiteral(in_RDI,(bool)in_stack_ffffffffffffffdf);
  return;
}

Assistant:

Literal(unsigned functor,unsigned arity,bool polarity) throw()
  {
    _functor = functor;
    _arity = arity;
    _args[0]._setPolarity(polarity);
    _args[0]._setSort(false);
    _args[0]._setLiteral(true);
  }